

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int32_t run_container_write(run_container_t *container,char *buf)

{
  int32_t iVar1;
  undefined2 *in_RSI;
  int *in_RDI;
  uint16_t cast_16;
  
  *in_RSI = (short)*in_RDI;
  memcpy(in_RSI + 1,*(void **)(in_RDI + 2),(long)*in_RDI << 2);
  iVar1 = run_container_size_in_bytes((run_container_t *)0x146294);
  return iVar1;
}

Assistant:

int32_t run_container_write(const run_container_t *container, char *buf) {
    uint16_t cast_16 = container->n_runs;
    memcpy(buf, &cast_16, sizeof(uint16_t));
    memcpy(buf + sizeof(uint16_t), container->runs,
           container->n_runs * sizeof(rle16_t));
    return run_container_size_in_bytes(container);
}